

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

tuple __thiscall
pybind11::make_tuple<(pybind11::return_value_policy)1,pybind11::str&>(pybind11 *this,str *args_)

{
  handle hVar1;
  handle *phVar2;
  cast_error *__return_storage_ptr__;
  array<pybind11::object,_1UL> args;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
  argtypes;
  handle local_60;
  string local_58;
  string local_38;
  
  phVar2 = handle::inc_ref((handle *)args_);
  local_60.m_ptr = phVar2->m_ptr;
  if (local_60.m_ptr == (PyObject *)0x0) {
    type_id<pybind11::str&>();
    __return_storage_ptr__ = (cast_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_58,0);
    cast_error_unable_to_convert_call_arg(__return_storage_ptr__,&local_58,&local_38);
    __cxa_throw(__return_storage_ptr__,&cast_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tuple::tuple<unsigned_long,_0>((tuple *)this,1);
  hVar1.m_ptr = local_60.m_ptr;
  local_60.m_ptr = (PyObject *)0x0;
  if ((*(byte *)(*(long *)(*(long *)this + 8) + 0xab) & 4) != 0) {
    *(PyObject **)(*(long *)this + 0x18) = hVar1.m_ptr;
    handle::dec_ref(&local_60);
    return (object)(object)this;
  }
  __assert_fail("PyTuple_Check(result.ptr())",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/pybind11/include/pybind11/detail/../cast.h"
                ,0x57d,
                "tuple pybind11::make_tuple(Args &&...) [policy = pybind11::return_value_policy::automatic_reference, Args = <pybind11::str &>]"
               );
}

Assistant:

tuple make_tuple(Args &&...args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args{{reinterpret_steal<object>(
        detail::make_caster<Args>::cast(std::forward<Args>(args_), policy, nullptr))...}};
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if !defined(PYBIND11_DETAILED_ERROR_MESSAGES)
            throw cast_error_unable_to_convert_call_arg(std::to_string(i));
#else
            std::array<std::string, size> argtypes{{type_id<Args>()...}};
            throw cast_error_unable_to_convert_call_arg(std::to_string(i), argtypes[i]);
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args) {
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    }
    return result;
}